

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void __thiscall ktxValidator::validateKvd(ktxValidator *this,validationContext *ctx)

{
  uint *args;
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  long *plVar10;
  uint *puVar11;
  _Alloc_hider _Var12;
  uint uVar13;
  uint *puVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  char *key;
  ktxHashList kvDataHead;
  uint32_t valueLen;
  uint32_t keyLen;
  char *prevKey;
  uint32_t keyLen_1;
  uint32_t prevKeyLen;
  char *local_290;
  char *local_288;
  ulong local_280;
  uint local_274;
  long local_270;
  uint32_t local_264;
  uint *local_260;
  uint8_t *local_258;
  validationContext *local_250;
  char *local_248;
  undefined1 local_240 [8];
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [4];
  undefined1 local_214 [4];
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  long local_180 [2];
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  long local_158 [2];
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  long local_130 [2];
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  long local_108 [2];
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  long local_e0 [2];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  long local_b8 [2];
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  long local_90 [2];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  long local_68 [2];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  long local_40 [2];
  
  uVar6 = (ulong)(ctx->header).keyValueData.byteLength;
  if (uVar6 == 0) {
    return;
  }
  local_260 = (uint *)operator_new__(uVar6);
  std::istream::read((char *)ctx->inp,(long)local_260);
  pcVar4 = *(char **)(*(long *)ctx->inp + -0x18);
  uVar13 = *(uint *)(ctx->inp + 0x20 + (long)pcVar4);
  if ((uVar13 & 5) == 0) {
    if ((uVar13 & 2) != 0) {
      local_80._0_4_ = IOError.UnexpectedEOF.code;
      plVar10 = local_68;
      local_78._M_p = (pointer)plVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,IOError.UnexpectedEOF.message._M_dataplus._M_p,
                 IOError.UnexpectedEOF.message._M_dataplus._M_p +
                 IOError.UnexpectedEOF.message._M_string_length);
      addIssue<>(this,eFatal,(issue *)local_80);
      _Var12._M_p = local_78._M_p;
      goto LAB_0010db54;
    }
  }
  else {
    local_58._0_4_ = IOError.FileRead.code;
    plVar10 = local_40;
    local_50._M_p = (pointer)plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,IOError.FileRead.message._M_dataplus._M_p,
               IOError.FileRead.message._M_dataplus._M_p + IOError.FileRead.message._M_string_length
              );
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    addIssue<char*>(this,eFatal,(issue *)local_58,pcVar4);
    _Var12._M_p = local_50._M_p;
LAB_0010db54:
    if ((long *)_Var12._M_p != plVar10) {
      operator_delete(_Var12._M_p,*plVar10 + 1);
    }
  }
  bVar15 = true;
  uVar13 = 0;
  puVar14 = local_260;
  pcVar8 = (char *)0x0;
  local_280 = uVar6;
  local_250 = ctx;
  do {
    args = puVar14 + 1;
    if (((uchar)puVar14[1] == 0xef) && (*(uchar *)((long)puVar14 + 5) == 0xbb)) {
      bVar16 = *(uchar *)((long)puVar14 + 6) == 0xbf;
      uVar6 = CONCAT71((int7)((ulong)pcVar4 >> 8),bVar16);
      puVar11 = (uint *)((long)puVar14 + 7);
      if (!bVar16) {
        puVar11 = args;
      }
    }
    else {
      uVar6 = 0;
      puVar11 = args;
    }
    pcVar4 = (char *)(ulong)*puVar14;
    puVar14 = (uint *)((uchar *)((long)puVar14 + (long)pcVar4) + 4);
    for (; (puVar11 < puVar14 && ((uchar)*puVar11 != '\0')); puVar11 = (uint *)((long)puVar11 + 1))
    {
    }
    pcVar9 = pcVar8;
    if (puVar11 == puVar14) {
      local_274 = (uint)uVar6;
      local_240._0_4_ = Metadata.MissingNulTerminator.code;
      local_288 = pcVar8;
      local_238._M_p = (pointer)&local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,Metadata.MissingNulTerminator.message._M_dataplus._M_p,
                 Metadata.MissingNulTerminator.message._M_dataplus._M_p +
                 Metadata.MissingNulTerminator.message._M_string_length);
      addIssue<unsigned_char*>(this,eError,(issue *)local_240,(uchar *)args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != &local_228) {
        operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
      }
      bVar15 = false;
      uVar6 = (ulong)local_274;
      pcVar9 = local_288;
    }
    if ((char)uVar6 != '\0') {
      local_288 = pcVar4;
      if (puVar11 == puVar14) {
        local_170._0_4_ = Metadata.ForbiddenBOM1.code;
        plVar10 = local_158;
        local_168._M_p = (pointer)plVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,Metadata.ForbiddenBOM1.message._M_dataplus._M_p,
                   Metadata.ForbiddenBOM1.message._M_dataplus._M_p +
                   Metadata.ForbiddenBOM1.message._M_string_length);
        addIssue<unsigned_char*>(this,eError,(issue *)local_170,(uchar *)args);
        _Var12._M_p = local_168._M_p;
      }
      else {
        local_198._0_4_ = Metadata.ForbiddenBOM2.code;
        plVar10 = local_180;
        local_190._M_p = (pointer)plVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,Metadata.ForbiddenBOM2.message._M_dataplus._M_p,
                   Metadata.ForbiddenBOM2.message._M_dataplus._M_p +
                   Metadata.ForbiddenBOM2.message._M_string_length);
        addIssue<unsigned_char*>(this,eError,(issue *)local_198,(uchar *)args);
        _Var12._M_p = local_190._M_p;
      }
      pcVar4 = local_288;
      if ((long *)_Var12._M_p != plVar10) {
        operator_delete(_Var12._M_p,*plVar10 + 1);
      }
    }
    fVar17 = ceilf((float)((ulong)pcVar4 & 0xffffffff) * 0.25);
    uVar6 = local_280;
    lVar7 = (long)(fVar17 * 4.0);
    uVar1 = (uint)(long)(fVar17 * 4.0 - 9.223372e+18) & (uint)(lVar7 >> 0x3f) | (uint)lVar7;
    uVar13 = uVar13 + 4 + uVar1;
    uVar5 = (uint)pcVar9 + 1;
    pcVar4 = (char *)(ulong)uVar5;
  } while ((uVar13 < (uint)local_280) &&
          (puVar14 = (uint *)((long)args + (ulong)uVar1), pcVar8 = pcVar4, (uint)pcVar9 < 0x4a));
  if (uVar5 == 0x4b) {
    local_a8._0_4_ = Metadata.InvalidStructure.code;
    plVar10 = local_90;
    local_a0._M_p = (pointer)plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,Metadata.InvalidStructure.message._M_dataplus._M_p,
               Metadata.InvalidStructure.message._M_dataplus._M_p +
               Metadata.InvalidStructure.message._M_string_length);
    addIssue<int>(this,eError,(issue *)local_a8,0x4b);
    _Var12._M_p = local_a0._M_p;
  }
  else {
    if (uVar13 == (uint)local_280) goto LAB_0010de63;
    local_d0._0_4_ = Metadata.MissingFinalPadding.code;
    plVar10 = local_b8;
    local_c8._M_p = (pointer)plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,Metadata.MissingFinalPadding.message._M_dataplus._M_p,
               Metadata.MissingFinalPadding.message._M_dataplus._M_p +
               Metadata.MissingFinalPadding.message._M_string_length);
    addIssue<>(this,eError,(issue *)local_d0);
    _Var12._M_p = local_c8._M_p;
  }
  if ((long *)_Var12._M_p != plVar10) {
    operator_delete(_Var12._M_p,*plVar10 + 1);
  }
LAB_0010de63:
  local_270 = 0;
  if (bVar15) {
    iVar2 = ktxHashList_Deserialize(&local_270,uVar6 & 0xffffffff,local_260);
    if (iVar2 == 0) {
      ktxHashListEntry_GetKey(local_270,local_214,&local_248);
      lVar7 = ktxHashList_Next(local_270);
      if (lVar7 != 0) {
        do {
          ktxHashListEntry_GetKey(lVar7,&local_258,&local_290);
          iVar2 = strcmp(local_248,local_290);
          if (0 < iVar2) {
            local_210._0_4_ = Metadata.OutOfOrder.code;
            local_208._M_p = (pointer)&local_1f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,Metadata.OutOfOrder.message._M_dataplus._M_p,
                       Metadata.OutOfOrder.message._M_dataplus._M_p +
                       Metadata.OutOfOrder.message._M_string_length);
            addIssue<>(this,eError,(issue *)local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_p != &local_1f8) {
              operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
            }
            if (0 < iVar2) break;
          }
          lVar7 = ktxHashList_Next(lVar7);
        } while (lVar7 != 0);
      }
      if (local_270 == 0) {
        bVar15 = false;
        uVar13 = 0;
      }
      else {
        local_280 = local_280 & 0xffffffff00000000;
        bVar15 = false;
        lVar7 = local_270;
        do {
          ktxHashListEntry_GetKey(lVar7,local_218,&local_290);
          ktxHashListEntry_GetValue(lVar7,&local_264,&local_258);
          pcVar4 = local_290;
          iVar2 = strncasecmp(local_290,"KTX",3);
          if (iVar2 == 0) {
            bVar16 = validateMetadata(this,local_250,pcVar4,local_258,local_264);
            if (!bVar16) {
              local_1c0._0_4_ = Metadata.IllegalMetadata.code;
              local_1b8._M_p = (pointer)&local_1a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,Metadata.IllegalMetadata.message._M_dataplus._M_p,
                         Metadata.IllegalMetadata.message._M_dataplus._M_p +
                         Metadata.IllegalMetadata.message._M_string_length);
              addIssue<char*>(this,eError,(issue *)local_1c0,local_290);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_p != &local_1a8) {
                operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
              }
            }
            pcVar4 = local_290;
            iVar2 = strncmp(local_290,"KTXwriter",9);
            if (iVar2 == 0) {
              bVar15 = true;
            }
            iVar2 = strncmp(pcVar4,"KTXwriterScParams",0x11);
            uVar13 = (uint)local_280 & 0xff;
            if (iVar2 == 0) {
              uVar13 = 1;
            }
            local_280 = CONCAT44(local_280._4_4_,uVar13);
          }
          else {
            local_1e8._0_4_ = Metadata.CustomMetadata.code;
            local_1e0._M_p = (pointer)&local_1d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e0,Metadata.CustomMetadata.message._M_dataplus._M_p,
                       Metadata.CustomMetadata.message._M_dataplus._M_p +
                       Metadata.CustomMetadata.message._M_string_length);
            addIssue<char*>(this,eWarning,(issue *)local_1e8,local_290);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_p != &local_1d0) {
              operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
            }
          }
          lVar7 = ktxHashList_Next(lVar7);
        } while (lVar7 != 0);
        uVar13 = (uint)local_280;
      }
      if (bVar15) {
        return;
      }
      if ((uVar13 & 1) == 0) {
        local_148._0_4_ = Metadata.NoKTXwriter.code;
        plVar10 = local_130;
        local_140._M_p = (pointer)plVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,Metadata.NoKTXwriter.message._M_dataplus._M_p,
                   Metadata.NoKTXwriter.message._M_dataplus._M_p +
                   Metadata.NoKTXwriter.message._M_string_length);
        addIssue<>(this,eWarning,(issue *)local_148);
        _Var12._M_p = local_140._M_p;
      }
      else {
        local_120._0_4_ = Metadata.NoRequiredKTXwriter.code;
        plVar10 = local_108;
        local_118._M_p = (pointer)plVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,Metadata.NoRequiredKTXwriter.message._M_dataplus._M_p,
                   Metadata.NoRequiredKTXwriter.message._M_dataplus._M_p +
                   Metadata.NoRequiredKTXwriter.message._M_string_length);
        addIssue<>(this,eError,(issue *)local_120);
        _Var12._M_p = local_118._M_p;
      }
    }
    else {
      local_f8._0_4_ = System.OutOfMemory.code;
      plVar10 = local_e0;
      local_f0._M_p = (pointer)plVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,System.OutOfMemory.message._M_dataplus._M_p,
                 System.OutOfMemory.message._M_dataplus._M_p +
                 System.OutOfMemory.message._M_string_length);
      addIssue<>(this,eError,(issue *)local_f8);
      _Var12._M_p = local_f0._M_p;
    }
    if ((long *)_Var12._M_p != plVar10) {
      operator_delete(_Var12._M_p,*plVar10 + 1);
    }
  }
  return;
}

Assistant:

void
ktxValidator::validateKvd(validationContext& ctx)
{
    uint32_t kvdLen = ctx.header.keyValueData.byteLength;
    uint32_t lengthCheck = 0;
    bool allKeysNulTerminated = true;

    if (kvdLen == 0)
        return;

    uint8_t* kvd = new uint8_t[kvdLen];
    ctx.inp->read((char *)kvd, kvdLen);
    if (ctx.inp->fail())
        addIssue(logger::eFatal, IOError.FileRead, strerror(errno));
    else if (ctx.inp->eof())
        addIssue(logger::eFatal, IOError.UnexpectedEOF);

    // Check all kv pairs have valuePadding and it's included in kvdLen;
    uint8_t* pCurKv = kvd;
    uint32_t safetyCount;
    // safetyCount ensures we don't get stuck in an infinite loop in the event
    // the kv data is completely bogus and the "lengths" never add up to kvdLen.
#define MAX_KVPAIRS 75
    for (safetyCount = 0; lengthCheck < kvdLen && safetyCount < MAX_KVPAIRS; safetyCount++) {
        uint32_t curKvLen = *(uint32_t *)pCurKv;
        lengthCheck += sizeof(uint32_t); // Add keyAndValueByteLength to total.
        pCurKv += sizeof(uint32_t); // Move pointer past keyAndValueByteLength.
        uint8_t* p = pCurKv;
        uint8_t* pCurKvEnd = pCurKv + curKvLen;

        // Check for BOM.
        bool bom = false;
        if (*p == 0xEF && *(p+1) == 0xBB && *(p+2) == 0xBF) {
            bom = true;
            p += 3;
        }
        for (; p < pCurKvEnd; p++) {
            if (*p == '\0')
              break;
        }
        bool noNul = (p == pCurKvEnd);
        if (noNul) {
            addIssue(logger::eError, Metadata.MissingNulTerminator, pCurKv);
            allKeysNulTerminated = false;
        }
        if (bom) {
            if (noNul)
                addIssue(logger::eError, Metadata.ForbiddenBOM1, pCurKv);
            else
                addIssue(logger::eError, Metadata.ForbiddenBOM2, pCurKv);
        }
        curKvLen = (uint32_t)padn(4, curKvLen);
        lengthCheck += curKvLen;
        pCurKv += curKvLen;
    }
    if (safetyCount == 75)
        addIssue(logger::eError, Metadata.InvalidStructure, MAX_KVPAIRS);
    else if (lengthCheck != kvdLen)
        addIssue(logger::eError, Metadata.MissingFinalPadding);

    ktxHashList kvDataHead = 0;
    ktxHashListEntry* entry;
    char* prevKey;
    uint32_t prevKeyLen;
    KTX_error_code result;
    bool writerFound = false;
    bool writerScParamsFound = false;

    if (allKeysNulTerminated) {
        result = ktxHashList_Deserialize(&kvDataHead, kvdLen, kvd);
        if (result != KTX_SUCCESS) {
            addIssue(logger::eError, System.OutOfMemory);
            return;
        }

        // Check the entries are sorted
        ktxHashListEntry_GetKey(kvDataHead, &prevKeyLen, &prevKey);
        entry = ktxHashList_Next(kvDataHead);
        for (; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen;
            char* key;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            if (strcmp(prevKey, key) > 0) {
                addIssue(logger::eError, Metadata.OutOfOrder);
                break;
            }
        }

        for (entry = kvDataHead; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen, valueLen;
            char* key;
            uint8_t* value;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
            if (strncasecmp(key, "KTX", 3) == 0) {
                if (!validateMetadata(ctx, key, value, valueLen)) {
                    addIssue(logger::eError, Metadata.IllegalMetadata, key);
                }
                if (strncmp(key, "KTXwriter", 9) == 0)
                    writerFound = true;
                if (strncmp(key, "KTXwriterScParams", 17) == 0)
                    writerScParamsFound = true;
            } else {
                addIssue(logger::eWarning, Metadata.CustomMetadata, key);
            }
        }
        if (!writerFound) {
            if (writerScParamsFound)
                addIssue(logger::eError, Metadata.NoRequiredKTXwriter);
            else
                addIssue(logger::eWarning, Metadata.NoKTXwriter);
        }
    }
}